

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O0

bool Kernel::MatchingUtils::
     matchTerms<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
               (TermList base,TermList instance,Binder *binder)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Term *this;
  Term *pTVar5;
  socklen_t in_ECX;
  Binder *in_RDX;
  sockaddr *in_RSI;
  Term *it;
  Term *bt;
  TermList local_10 [2];
  
  bVar1 = TermList::isTerm((TermList *)0x443b4d);
  if (!bVar1) {
    uVar3 = TermList::var(local_10);
    iVar4 = Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
            Binder::bind(in_RDX,uVar3,in_RSI,in_ECX);
    return (bool)((byte)iVar4 & 1);
  }
  this = TermList::term((TermList *)0x443b60);
  bVar1 = TermList::isTerm((TermList *)0x443b6f);
  if (bVar1) {
    pTVar5 = TermList::term((TermList *)0x443b7f);
    uVar3 = Term::functor(pTVar5);
    pTVar5 = TermList::term((TermList *)0x443b95);
    uVar2 = Term::functor(pTVar5);
    if (uVar3 == uVar2) {
      pTVar5 = TermList::term((TermList *)0x443bbb);
      bVar1 = Term::shared((Term *)0x443bca);
      if ((bVar1) && (bVar1 = Term::shared((Term *)0x443bda), bVar1)) {
        bVar1 = Term::ground((Term *)0x443bea);
        if (bVar1) {
          return this == pTVar5;
        }
        uVar3 = Term::weight(this);
        uVar2 = Term::weight(pTVar5);
        if (uVar2 < uVar3) {
          return false;
        }
      }
      TermList::term((TermList *)0x443c3d);
      TermList::term((TermList *)0x443c4c);
      bVar1 = matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::Binder>
                        ((Term *)base._content,(Term *)instance._content,binder);
      return bVar1;
    }
  }
  return false;
}

Assistant:

static bool matchTerms(TermList base, TermList instance, Binder& binder)
  {
    if(base.isTerm()) {
      Term* bt=base.term();
      if(!instance.isTerm() || base.term()->functor()!=instance.term()->functor()) {
        return false;
      }
      Term* it=instance.term();
      if(bt->shared() && it->shared()) {
        if(bt->ground()) {
          return bt==it;
        }
        if(bt->weight() > it->weight()) {
          return false;
        }
      }
      ASS_G(base.term()->arity(),0);
      return matchArgs(base.term(), instance.term(), binder);
    } else {
      ASS(base.isOrdinaryVar());
      return binder.bind(base.var(), instance);
    }
  }